

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

int __thiscall cimg_library::CImgDisplay::close(CImgDisplay *this,int __fd)

{
  Display *pDVar1;
  X11_info *pXVar2;
  
  if (((this->_width != 0) && (this->_height != 0)) && (this->_is_closed == false)) {
    pXVar2 = cimg::X11_attr();
    pDVar1 = pXVar2->display;
    XLockDisplay(pDVar1);
    if (this->_is_fullscreen == true) {
      _desinit_fullscreen(this);
    }
    XUnmapWindow(pDVar1,this->_window);
    this->_window_y = -1;
    this->_window_x = this->_window_y;
    this->_is_closed = true;
    XUnlockDisplay(pDVar1);
  }
  return (int)this;
}

Assistant:

CImgDisplay& close() {
      if (is_empty() || _is_closed) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      if (_is_fullscreen) _desinit_fullscreen();
      XUnmapWindow(dpy,_window);
      _window_x = _window_y = -1;
      _is_closed = true;
      XUnlockDisplay(dpy);
      return *this;
    }